

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

bool commandLineSolverOk(HighsLogOptions *report_log_options,string *value)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(value,&kSimplexString_abi_cxx11_);
  bVar2 = true;
  if (!_Var1) {
    _Var1 = std::operator==(value,&kHighsChooseString_abi_cxx11_);
    if (!_Var1) {
      _Var1 = std::operator==(value,&kIpmString_abi_cxx11_);
      if (!_Var1) {
        _Var1 = std::operator==(value,&kPdlpString_abi_cxx11_);
        if (!_Var1) {
          bVar2 = false;
          highsLogUser(report_log_options,kWarning,
                       "Value \"%s\" for solver option is not one of \"%s\", \"%s\", \"%s\" or \"%s\"\n"
                       ,(value->_M_dataplus)._M_p,kSimplexString_abi_cxx11_._M_dataplus._M_p,
                       kHighsChooseString_abi_cxx11_._M_dataplus._M_p,
                       kIpmString_abi_cxx11_._M_dataplus._M_p,
                       kPdlpString_abi_cxx11_._M_dataplus._M_p);
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool commandLineSolverOk(const HighsLogOptions& report_log_options,
                         const string& value) {
  if (value == kSimplexString || value == kHighsChooseString ||
      value == kIpmString || value == kPdlpString)
    return true;
  highsLogUser(report_log_options, HighsLogType::kWarning,
               "Value \"%s\" for solver option is not one of \"%s\", \"%s\", "
               "\"%s\" or \"%s\"\n",
               value.c_str(), kSimplexString.c_str(),
               kHighsChooseString.c_str(), kIpmString.c_str(),
               kPdlpString.c_str());
  return false;
}